

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraction.cpp
# Opt level: O3

Fraction operator+(int *a,Fraction *b)

{
  Fraction FVar1;
  uint uVar2;
  uint __n;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  FVar1 = *b;
  uVar4 = FVar1.denominator_;
  uVar5 = *a * uVar4 + FVar1.numerator_;
  uVar3 = uVar5;
  if ((int)uVar5 < 1) {
    uVar3 = -uVar5;
  }
  uVar2 = -uVar5;
  __n = -uVar4;
  if (-1 < (long)FVar1) {
    uVar2 = uVar5;
    __n = uVar4;
  }
  uVar3 = std::__detail::__gcd<unsigned_int>(uVar3,__n);
  return (Fraction)
         ((long)(int)__n / (long)(int)uVar3 << 0x20 |
         (long)(int)uVar2 / (long)(int)uVar3 & 0xffffffffU);
}

Assistant:

Fraction operator+(const int& a, const Fraction& b) {
  Fraction current_frac = b;
  current_frac.numerator_ += b.denominator_ * a;
  current_frac.Normalization();
  return current_frac;
}